

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

void predict_or_learn_active_cover<true>(active_cover *a,single_learner *base,example *ec)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 *puVar5;
  bool bVar6;
  uchar *puVar7;
  EVP_PKEY_CTX *tbs;
  EVP_PKEY_CTX *in_RDX;
  size_t *siglen;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *extraout_RDX_01;
  size_t *siglen_02;
  size_t *extraout_RDX_02;
  size_t *siglen_03;
  size_t *siglen_04;
  size_t *siglen_05;
  size_t *siglen_06;
  size_t *siglen_07;
  size_t *siglen_08;
  size_t *siglen_09;
  size_t *extraout_RDX_03;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar10;
  float extraout_XMM0_Da_02;
  float fVar11;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float extraout_XMM0_Da_09;
  double dVar12;
  double dVar13;
  __type_conflict _Var14;
  size_t i;
  float r;
  float ec_output_weight;
  float ec_output_label;
  float cost_delta;
  float cost;
  float s;
  float p;
  float q2;
  float importance;
  float pmin;
  bool in_dis;
  float threshold;
  float ec_input_label;
  float ec_input_weight;
  float t;
  float prediction;
  vw *all;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float fVar15;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  bool bVar16;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar17;
  undefined4 in_stack_ffffffffffffff88;
  float fVar18;
  undefined4 in_stack_ffffffffffffff8c;
  uchar *local_68;
  float local_54;
  float local_50;
  float local_44;
  
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,(example *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  puVar5 = *(undefined8 **)(in_RDI + 0x28);
  uVar1 = *(undefined4 *)(in_RDX + 0x6850);
  dVar12 = *(double *)(**(long **)(in_RDI + 0x28) + 0x18);
  fVar2 = *(float *)(in_RDX + 0x6870);
  uVar3 = *(undefined4 *)(in_RDX + 0x6828);
  fVar8 = get_threshold(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  bVar6 = dis_test((vw *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (example *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (single_learner *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  local_44 = get_pmin(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  puVar7 = (uchar *)(ulong)bVar6;
  sig = in_RSI;
  ctx = in_RDI;
  fVar9 = query_decision((active_cover *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (single_learner *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (example *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                         SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
  if (bVar6) {
    if (fVar9 <= 0.0) {
      *(undefined4 *)(in_RDX + 0x6828) = 0x7f7fffff;
      *(undefined4 *)(in_RDX + 0x6870) = 0;
      siglen_02 = siglen;
    }
    else {
      puVar7 = (uchar *)(*(long *)*puVar5 + 1);
      *(long *)*puVar5 = (long)puVar7;
      *(float *)(in_RDX + 0x6870) = fVar2 * fVar9;
      *(undefined4 *)(in_RDX + 0x6828) = uVar3;
      sig = in_RDX;
      ctx = in_RSI;
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (example *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      siglen_02 = extraout_RDX_00;
    }
  }
  else {
    sign(ctx,(uchar *)sig,siglen,puVar7,in_R8);
    *(undefined4 *)(in_RDX + 0x6828) = extraout_XMM0_Da;
    *(float *)(in_RDX + 0x6870) = fVar2;
    sig = in_RDX;
    ctx = in_RSI;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (example *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    siglen_02 = extraout_RDX;
  }
  local_44 = local_44 * 4.0 * local_44;
  local_54 = 0.0;
  uVar3 = *(undefined4 *)(in_RDX + 0x6828);
  uVar4 = *(undefined4 *)(in_RDX + 0x6870);
  fVar8 = ((fVar8 * 2.0 * (float)dVar12 * *(float *)(in_RDI + 4)) / *(float *)in_RDI) /
          *(float *)(in_RDI + 8);
  if (bVar6) {
    fVar15 = fVar8;
    dVar12 = std::fmax((double)(ulong)(uint)fVar9,0.0);
    sign(ctx,(uchar *)sig,siglen_00,puVar7,in_R8);
    sign(ctx,(uchar *)sig,siglen_01,puVar7,in_R8);
    local_50 = fVar15 * SUB84(dVar12,0) *
               (float)(-(uint)(extraout_XMM0_Da_00 != extraout_XMM0_Da_01) & 0x3f800000);
    siglen_02 = extraout_RDX_01;
  }
  else {
    local_50 = 0.0;
    local_54 = -fVar8;
  }
  for (local_68 = (uchar *)0x0; local_68 < *(uchar **)(in_RDI + 0x10); local_68 = local_68 + 1) {
    tbs = in_RDI;
    if (bVar6) {
      dVar12 = std::sqrt((double)(ulong)(uint)local_44);
      fVar10 = SUB84(dVar12,0);
      dVar12 = std::sqrt((double)(ulong)(uint)local_44);
      fVar15 = *(float *)(in_RDI + 4);
      fVar11 = *(float *)(in_RDI + 4);
      fVar17 = fVar8;
      fVar18 = local_50;
      dVar13 = std::fmax((double)(ulong)(uint)fVar9,0.0);
      local_54 = (fVar18 + fVar18 + -(fVar17 * SUB84(dVar13,0))) -
                 (fVar15 * 2.0 * fVar11 + -(1.0 / (fVar10 / (SUB84(dVar12,0) + 1.0))));
      siglen_02 = extraout_RDX_02;
    }
    sign(ctx,(uchar *)sig,siglen_02,(uchar *)tbs,in_R8);
    fVar11 = -extraout_XMM0_Da_02;
    sign(ctx,(uchar *)sig,siglen_03,(uchar *)tbs,in_R8);
    *(float *)(in_RDX + 0x6828) = fVar11 * extraout_XMM0_Da_03;
    fVar15 = fVar2;
    dVar12 = std::fabs((double)(ulong)(uint)local_54);
    *(float *)(in_RDX + 0x6870) = fVar15 * SUB84(dVar12,0);
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffff74,fVar15),
               (example *)CONCAT44(fVar11,in_stack_ffffffffffffff68),
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    sig = in_RDX;
    ctx = in_RSI;
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffff74,fVar15),
               (example *)CONCAT44(fVar11,in_stack_ffffffffffffff68),
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    sign(ctx,(uchar *)sig,siglen_04,(uchar *)tbs,in_R8);
    in_stack_ffffffffffffff74 = extraout_XMM0_Da_04;
    sign(ctx,(uchar *)sig,siglen_05,(uchar *)tbs,in_R8);
    *(float *)(*(long *)(in_RDI + 0x18) + (long)local_68 * 4) =
         (float)(-(uint)(in_stack_ffffffffffffff74 != extraout_XMM0_Da_05) & 0x3f800000) * 2.0 *
         local_54 + *(float *)(*(long *)(in_RDI + 0x18) + (long)local_68 * 4);
    dVar12 = std::fmax((double)(ulong)*(uint *)(*(long *)(in_RDI + 0x18) + (long)local_68 * 4),0.0);
    *(int *)(*(long *)(in_RDI + 0x18) + (long)local_68 * 4) = SUB84(dVar12,0);
    puVar7 = local_68;
    sign(ctx,(uchar *)sig,siglen_06,local_68,in_R8);
    fVar15 = extraout_XMM0_Da_06;
    sign(ctx,(uchar *)sig,siglen_07,puVar7,in_R8);
    bVar16 = bVar6;
    if ((fVar15 == extraout_XMM0_Da_07) && (!NAN(fVar15) && !NAN(extraout_XMM0_Da_07))) {
      bVar16 = false;
    }
    in_stack_ffffffffffffff64 = (float)bVar16;
    _Var14 = std::pow<float,double>
                       (in_stack_ffffffffffffff64,
                        (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *(float *)(*(long *)(in_RDI + 0x20) + (long)local_68 * 4) =
         *(float *)(*(long *)(in_RDI + 0x20) + (long)local_68 * 4) +
         in_stack_ffffffffffffff64 / (float)_Var14;
    puVar7 = local_68;
    sign(ctx,(uchar *)sig,siglen_08,local_68,in_R8);
    in_stack_ffffffffffffff68 = extraout_XMM0_Da_08;
    sign(ctx,(uchar *)sig,siglen_09,puVar7,in_R8);
    local_44 = (float)(-(uint)(in_stack_ffffffffffffff68 != extraout_XMM0_Da_09) & 0x3f800000) *
               (*(float *)(*(long *)(in_RDI + 0x18) + (long)local_68 * 4) /
               *(float *)(*(long *)(in_RDI + 0x20) + (long)local_68 * 4)) + local_44;
    siglen_02 = extraout_RDX_03;
  }
  *(undefined4 *)(in_RDX + 0x6870) = uVar4;
  *(undefined4 *)(in_RDX + 0x6828) = uVar3;
  *(undefined4 *)(in_RDX + 0x6850) = uVar1;
  return;
}

Assistant:

void predict_or_learn_active_cover(active_cover& a, single_learner& base, example& ec)
{
  base.predict(ec, 0);

  if (is_learn)
  {
    vw& all = *a.all;

    float prediction = ec.pred.scalar;
    float t = (float)a.all->sd->t;
    float ec_input_weight = ec.weight;
    float ec_input_label = ec.l.simple.label;

    // Compute threshold defining allowed set A
    float threshold = get_threshold((float)all.sd->sum_loss, t, a.active_c0, a.alpha);
    bool in_dis = dis_test(all, ec, base, prediction, threshold);
    float pmin = get_pmin((float)all.sd->sum_loss, t);
    float importance = query_decision(a, base, ec, prediction, pmin, in_dis);

    // Query (or not)
    if (!in_dis)  // Use predicted label
    {
      ec.l.simple.label = sign(prediction);
      ec.weight = ec_input_weight;
      base.learn(ec, 0);
    }
    else if (importance > 0)  // Use importance-weighted example
    {
      all.sd->queries += 1;
      ec.weight = ec_input_weight * importance;
      ec.l.simple.label = ec_input_label;
      base.learn(ec, 0);
    }
    else  // skipped example
    {
      // Make sure the loss computation does not include
      // skipped examples
      ec.l.simple.label = FLT_MAX;
      ec.weight = 0;
    }

    // Update the learners in the cover and their weights
    float q2 = 4.f * pmin * pmin;
    float p, s, cost, cost_delta = 0;
    float ec_output_label = ec.l.simple.label;
    float ec_output_weight = ec.weight;
    float r = 2.f * threshold * t * a.alpha / a.active_c0 / a.beta_scale;

    // Set up costs
    // cost = cost of predicting erm's prediction
    // cost_delta = cost - cost of predicting the opposite label
    if (in_dis)
    {
      cost = r * (fmax(importance, 0.f)) * ((float)(sign(prediction) != sign(ec_input_label)));
    }
    else
    {
      cost = 0.f;
      cost_delta = -r;
    }

    for (size_t i = 0; i < a.cover_size; i++)
    {
      // Update cost
      if (in_dis)
      {
        p = sqrt(q2) / (1.f + sqrt(q2));
        s = 2.f * a.alpha * a.alpha - 1.f / p;
        cost_delta = 2.f * cost - r * (fmax(importance, 0.f)) - s;
      }

      // Choose min-cost label as the label
      // Set importance weight to be the cost difference
      ec.l.simple.label = -1.f * sign(cost_delta) * sign(prediction);
      ec.weight = ec_input_weight * fabs(cost_delta);

      // Update learner
      base.learn(ec, i + 1);
      base.predict(ec, i + 1);

      // Update numerator of lambda
      a.lambda_n[i] += 2.f * ((float)(sign(ec.pred.scalar) != sign(prediction))) * cost_delta;
      a.lambda_n[i] = fmax(a.lambda_n[i], 0.f);

      // Update denominator of lambda
      a.lambda_d[i] += ((float)(sign(ec.pred.scalar) != sign(prediction) && in_dis)) / (float)pow(q2, 1.5);

      // Accumulating weights of learners in the cover
      q2 += ((float)(sign(ec.pred.scalar) != sign(prediction))) * (a.lambda_n[i] / a.lambda_d[i]);
    }

    // Restoring the weight, the label, and the prediction
    ec.weight = ec_output_weight;
    ec.l.simple.label = ec_output_label;
    ec.pred.scalar = prediction;
  }
}